

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O1

int __thiscall
kratos::SequentialStmtBlock::clone
          (SequentialStmtBlock *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> local_48;
  SequentialStmtBlock *local_30;
  shared_ptr<kratos::SequentialStmtBlock> stmt;
  
  local_30 = (SequentialStmtBlock *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::SequentialStmtBlock,std::allocator<kratos::SequentialStmtBlock>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt,&local_30,
             (allocator<kratos::SequentialStmtBlock> *)&local_48);
  std::__shared_ptr<kratos::SequentialStmtBlock,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::SequentialStmtBlock,kratos::SequentialStmtBlock>
            ((__shared_ptr<kratos::SequentialStmtBlock,(__gnu_cxx::_Lock_policy)2> *)&local_30,
             local_30);
  std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::vector
            (&local_48,
             (vector<kratos::EventControl,_std::allocator<kratos::EventControl>_> *)(__fn + 0xe0));
  std::vector<kratos::EventControl,_std::allocator<kratos::EventControl>_>::_M_move_assign
            (&local_30->conditions_,&local_48);
  if (local_48.super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<kratos::EventControl,_std::allocator<kratos::EventControl>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  StmtBlock::clone_block((StmtBlock *)__fn,&local_30->super_StmtBlock);
  (this->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode = (_func_int **)local_30;
  (this->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)stmt.super___shared_ptr<kratos::SequentialStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> SequentialStmtBlock::clone() const {
    auto stmt = std::make_shared<SequentialStmtBlock>();
    stmt->conditions_ = std::vector(conditions_);
    clone_block(stmt.get());
    return stmt;
}